

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O1

int Mvc_CubeCompareIntUnderMask(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar2 != 0) {
    if (uVar2 != 1) {
      while( true ) {
        uVar4 = pC1->pData[uVar2] & pMask->pData[uVar2];
        uVar3 = pMask->pData[uVar2] & pC2->pData[uVar2];
        if (uVar4 < uVar3) {
          return -1;
        }
        if (uVar3 < uVar4) break;
        bVar1 = (int)uVar2 < 1;
        uVar2 = uVar2 - 1;
        if (bVar1) {
          return 0;
        }
      }
      return 1;
    }
    uVar3 = *(uint *)&pC1->field_0x14 & *(uint *)&pMask->field_0x14;
    uVar2 = *(uint *)&pMask->field_0x14 & *(uint *)&pC2->field_0x14;
    if (uVar3 < uVar2) {
      return -1;
    }
    if (uVar3 >= uVar2 && uVar3 != uVar2) {
      return 1;
    }
  }
  uVar3 = pC1->pData[0] & pMask->pData[0];
  uVar2 = pMask->pData[0] & pC2->pData[0];
  if (uVar3 < uVar2) {
    return -1;
  }
  return (int)(uVar2 < uVar3);
}

Assistant:

int Mvc_CubeCompareIntUnderMask( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    unsigned uBits1, uBits2;

    // compare the cubes under the mask
    if ( Mvc_Cube1Words(pC1) )
    {
        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        // cubes are equal
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        uBits1 = pC1->pData[1] & pMask->pData[1];
        uBits2 = pC2->pData[1] & pMask->pData[1];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast(pC1);
        for(; i >= 0; i--)
        {
            uBits1 = pC1->pData[i] & pMask->pData[i];
            uBits2 = pC2->pData[i] & pMask->pData[i];
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
        return 0;
    }
}